

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

bool __thiscall
cmCMakePresetsGraph::ConfigurePreset::VisitPresetAfterInherit
          (ConfigurePreset *this,int version,cmJSONState *state)

{
  bool bVar1;
  const_iterator cVar2;
  key_type local_38;
  
  if ((this->super_Preset).Hidden == false) {
    if (version < 3) {
      if ((this->Generator)._M_string_length == 0) {
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"generator","");
        cmCMakePresetsErrors::PRESET_MISSING_FIELD(&(this->super_Preset).Name,&local_38,state);
      }
      else {
        if ((this->BinaryDir)._M_string_length != 0) goto LAB_0032e925;
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"binaryDir","");
        cmCMakePresetsErrors::PRESET_MISSING_FIELD(&(this->super_Preset).Name,&local_38,state);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    else {
LAB_0032e925:
      if ((((((this->WarnDev).super__Optional_base<bool,_true,_true>._M_payload.
              super__Optional_payload_base<bool>._M_engaged != true) ||
            ((this->WarnDev).super__Optional_base<bool,_true,_true>._M_payload.
             super__Optional_payload_base<bool>._M_payload._M_value != false)) ||
           ((this->ErrorDev).super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool>._M_engaged != true)) ||
          ((this->ErrorDev).super__Optional_base<bool,_true,_true>._M_payload.
           super__Optional_payload_base<bool>._M_payload._M_value == false)) &&
         ((((this->WarnDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool>._M_engaged != true ||
           ((this->WarnDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool>._M_payload._M_value != false)) ||
          (((this->ErrorDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool>._M_engaged != true ||
           ((this->ErrorDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool>._M_payload._M_value == false)))))) {
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
        cVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
                ::find(&(this->CacheVariables)._M_t,&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        if ((_Rb_tree_header *)cVar2._M_node ==
            &(this->CacheVariables)._M_t._M_impl.super__Rb_tree_header) goto LAB_0032e8f7;
      }
    }
    bVar1 = false;
  }
  else {
LAB_0032e8f7:
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool cmCMakePresetsGraph::ConfigurePreset::VisitPresetAfterInherit(
  int version, cmJSONState* state)
{
  auto& preset = *this;
  if (!preset.Hidden) {
    if (version < 3) {
      if (preset.Generator.empty()) {
        cmCMakePresetsErrors::PRESET_MISSING_FIELD(preset.Name, "generator",
                                                   state);
        return false;
      }
      if (preset.BinaryDir.empty()) {
        cmCMakePresetsErrors::PRESET_MISSING_FIELD(preset.Name, "binaryDir",
                                                   state);
        return false;
      }
    }

    if (preset.WarnDev == false && preset.ErrorDev == true) {
      return false;
    }
    if (preset.WarnDeprecated == false && preset.ErrorDeprecated == true) {
      return false;
    }
    if (preset.CacheVariables.count("") != 0) {
      return false;
    }
  }

  return true;
}